

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O0

NumericExpr __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::MakeUnary
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,Kind kind,NumericExpr arg)

{
  Kind in_ESI;
  TestProblemBuilder *in_RDI;
  Argument1 in_stack_ffffffffffffff88;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  BasicTestExpr<0> *local_20;
  Kind local_14 [3];
  BasicTestExpr<0> local_8;
  BasicTestExpr<0> local_4;
  
  local_20 = &local_8;
  local_14[0] = in_ESI;
  internal::Unused<mp::expr::Kind,BasicTestExpr<0>*>(local_14,&local_20);
  expr::str(local_14[0]);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  TestProblemBuilder::ReportUnhandledConstruct(in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator(&local_41);
  BasicTestExpr<0>::BasicTestExpr(&local_4,NULL_ID);
  return (NumericExpr)local_4.id_;
}

Assistant:

NumericExpr MakeUnary(expr::Kind kind, NumericExpr arg) {
    internal::Unused(kind, &arg);
    MP_DISPATCH(ReportUnhandledConstruct(str(kind)));
    return NumericExpr();
  }